

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O0

void __thiscall
OpenMesh::RandomNumberGenerator::RandomNumberGenerator
          (RandomNumberGenerator *this,size_t _resolution)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  uint local_24;
  double dStack_20;
  uint i;
  double tmp;
  size_t _resolution_local;
  RandomNumberGenerator *this_local;
  
  this->resolution_ = _resolution;
  this->iterations_ = 1;
  this->maxNum_ = 2147483648.0;
  sVar1 = this->resolution_;
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  for (dStack_20 = (auVar2._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
      2147483648.0 < dStack_20; dStack_20 = dStack_20 / 2147483648.0) {
    this->iterations_ = this->iterations_ + 1;
  }
  for (local_24 = 0; (ulong)local_24 < this->iterations_ - 1; local_24 = local_24 + 1) {
    this->maxNum_ = this->maxNum_ * 2147483648.0;
  }
  return;
}

Assistant:

RandomNumberGenerator::RandomNumberGenerator(const size_t _resolution) :
  resolution_(_resolution),
  iterations_(1),
  maxNum_(RAND_MAX + 1.0)
{
  double tmp = double(resolution_);
  while (tmp > (double(RAND_MAX) + 1.0) ) {
    iterations_++;
    tmp /= (double(RAND_MAX) + 1.0);
  }

  for ( unsigned int i = 0 ; i < iterations_ - 1; ++i ) {
    maxNum_ *= (RAND_MAX + 1.0);
  }
}